

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summary_impl.hpp
# Opt level: O0

void __thiscall
ylt::metric::detail::summary_impl<unsigned_long,_6UL>::~summary_impl
          (summary_impl<unsigned_long,_6UL> *this)

{
  data_t *this_00;
  iterator pvVar1;
  __pointer_type pdVar2;
  long in_RDI;
  value_type *data;
  iterator __end0;
  iterator __begin0;
  array<std::atomic<ylt::metric::detail::summary_impl<unsigned_long,_6UL>::data_t_*>,_2UL> *__range3
  ;
  iterator local_18;
  
  this_00 = (data_t *)(in_RDI + 0x18);
  local_18 = std::
             array<std::atomic<ylt::metric::detail::summary_impl<unsigned_long,_6UL>::data_t_*>,_2UL>
             ::begin((array<std::atomic<ylt::metric::detail::summary_impl<unsigned_long,_6UL>::data_t_*>,_2UL>
                      *)0x1bd8a1);
  pvVar1 = std::
           array<std::atomic<ylt::metric::detail::summary_impl<unsigned_long,_6UL>::data_t_*>,_2UL>
           ::end((array<std::atomic<ylt::metric::detail::summary_impl<unsigned_long,_6UL>::data_t_*>,_2UL>
                  *)0x1bd8b0);
  for (; local_18 != pvVar1; local_18 = local_18 + 1) {
    pdVar2 = std::atomic::operator_cast_to_data_t_
                       ((atomic<ylt::metric::detail::summary_impl<unsigned_long,_6UL>::data_t_*> *)
                        0x1bd8d5);
    if (pdVar2 != (__pointer_type)0x0) {
      data_t::~data_t(this_00);
      operator_delete(pdVar2,0x400);
    }
  }
  return;
}

Assistant:

~summary_impl() {
    for (auto& data : data_) {
      delete data;
    }
  }